

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_z.cpp
# Opt level: O0

complex<double> zdotc(int n,complex<double> *cx,int incx,complex<double> *cy,int incy)

{
  undefined8 extraout_RDX;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 uVar2;
  complex<double> cVar3;
  complex<double> local_b8;
  complex<double> local_a8 [2];
  complex<double> local_88;
  complex<double> local_78 [2];
  complex<double> local_58;
  int local_48;
  int local_44;
  int iy;
  int ix;
  int i;
  int incy_local;
  complex<double> *cy_local;
  complex<double> *pcStack_28;
  int incx_local;
  complex<double> *cx_local;
  undefined1 auStack_18 [4];
  int n_local;
  complex<double> value;
  undefined8 uVar1;
  
  ix = incy;
  _i = cy;
  cy_local._4_4_ = incx;
  pcStack_28 = cx;
  cx_local._4_4_ = n;
  std::complex<double>::complex((complex<double> *)auStack_18,0.0,0.0);
  uVar2 = 0;
  std::complex<double>::complex(&local_58,0.0,0.0);
  _auStack_18 = local_58._M_value._0_8_;
  value._M_value._0_8_ = local_58._M_value._8_8_;
  uVar1 = extraout_RDX;
  if (0 < cx_local._4_4_) {
    if ((cy_local._4_4_ == 1) && (ix == 1)) {
      for (iy = 0; iy < cx_local._4_4_; iy = iy + 1) {
        std::conj<double>(pcStack_28 + iy);
        local_88._M_value._8_8_ = uVar2;
        std::operator*(&local_88,_i + iy);
        local_78[0]._M_value._8_8_ = uVar2;
        cVar3 = std::operator+((complex<double> *)auStack_18,local_78);
        uVar1 = cVar3._M_value._8_8_;
        local_78[1]._M_value._8_8_ = uVar2;
        _auStack_18 = extraout_XMM0_Qa;
        value._M_value._0_8_ = uVar2;
      }
    }
    else {
      if (cy_local._4_4_ < 0) {
        local_44 = (1 - cx_local._4_4_) * cy_local._4_4_;
      }
      else {
        local_44 = 0;
      }
      if (ix < 0) {
        local_48 = (1 - cx_local._4_4_) * ix;
      }
      else {
        local_48 = 0;
      }
      for (iy = 0; iy < cx_local._4_4_; iy = iy + 1) {
        std::conj<double>(pcStack_28 + local_44);
        local_b8._M_value._8_8_ = uVar2;
        std::operator*(&local_b8,_i + local_48);
        local_a8[0]._M_value._8_8_ = uVar2;
        cVar3 = std::operator+((complex<double> *)auStack_18,local_a8);
        uVar1 = cVar3._M_value._8_8_;
        local_44 = local_44 + cy_local._4_4_;
        local_48 = local_48 + ix;
        local_a8[1]._M_value._8_8_ = uVar2;
        _auStack_18 = extraout_XMM0_Qa_00;
        value._M_value._0_8_ = uVar2;
      }
    }
    local_58._M_value._8_8_ = ZEXT48((uint)iy);
  }
  cVar3._M_value._8_8_ = uVar1;
  cVar3._M_value._0_8_ = local_58._M_value._8_8_;
  return (complex<double>)cVar3._M_value;
}

Assistant:

complex <double> zdotc ( int n, complex <double> cx[], int incx,
  complex <double> cy[], int incy )

//****************************************************************************80
//
//  Purpose:
//
//    ZDOTC forms the conjugated dot product of two complex <double> vectors.
//
//  Discussion:
//
//    This routine uses double precision complex arithmetic.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    15 April 2006
//
//  Author:
//
//    C++ version by John Burkardt
//
//  Reference:
//
//    Jack Dongarra, Cleve Moler, Jim Bunch, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for Fortran Usage,
//    Algorithm 539,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, September 1979, pages 308-323.
//
//  Parameters:
//
//    Input, int N, the number of entries in the vectors.
//
//    Input, complex <double> CX[], the first vector.
//
//    Input, int INCX, the increment between successive entries in CX.
//
//    Input, complex <double> CY[], the second vector.
//
//    Input, int INCY, the increment between successive entries in CY.
//
//    Output, complex <double> ZDOTC, the conjugated dot product of
//    the corresponding entries of CX and CY.
//
{
  int i;
  int ix;
  int iy;
  complex <double> value;

  value = complex <double> ( 0.0, 0.0 );

  if ( n <= 0 )
  {
    return value;
  }

  if ( incx == 1 && incy == 1 )
  {
    for ( i = 0; i < n; i++ )
    {
      value = value + conj ( cx[i] ) * cy[i];
    }
  }
  else
  {
    if ( 0 <= incx )
    {
      ix = 0;
    }
    else
    {
      ix = ( -n + 1 ) * incx;
    }

    if ( 0 <= incy )
    {
      iy = 0;
    }
    else
    {
      iy = ( -n + 1 ) * incy;
    }

    for ( i = 0; i < n; i++ )
    {
      value = value + conj ( cx[ix] ) * cy[iy];
      ix = ix + incx;
      iy = iy + incy;
    }
  }
  return value;
}